

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O3

bool __thiscall
VW::config::options_serializer_boost_po::serialize_if_t<std::vector<int,std::allocator<int>>>
          (options_serializer_boost_po *this,base_option *base_option)

{
  size_t sVar1;
  size_t sVar2;
  typed_option<std::vector<int,_std::allocator<int>_>_> *ptVar3;
  typed_option<std::vector<int,_std::allocator<int>_>_> typed;
  typed_option<std::vector<int,_std::allocator<int>_>_> local_160;
  typed_option<std::vector<int,_std::allocator<int>_>_> local_c0;
  
  sVar1 = base_option->m_type_hash;
  sVar2 = std::type_info::hash_code((type_info *)&std::vector<int,std::allocator<int>>::typeinfo);
  if (sVar1 == sVar2) {
    ptVar3 = (typed_option<std::vector<int,_std::allocator<int>_>_> *)
             __dynamic_cast(base_option,&config::base_option::typeinfo,
                            &typed_option<std::vector<int,std::allocator<int>>>::typeinfo,0);
    if (ptVar3 == (typed_option<std::vector<int,_std::allocator<int>_>_> *)0x0) {
      __cxa_bad_cast();
    }
    typed_option<std::vector<int,_std::allocator<int>_>_>::typed_option(&local_c0,ptVar3);
    typed_option<std::vector<int,_std::allocator<int>_>_>::typed_option(&local_160,&local_c0);
    serialize<int>(this,&local_160);
    local_160.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4a28;
    if (local_160.m_default_value.
        super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_160.m_default_value.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_160.m_value.
        super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_160.m_value.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    config::base_option::~base_option(&local_160.super_base_option);
    local_c0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4a28;
    if (local_c0.m_default_value.
        super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.m_default_value.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_c0.m_value.
        super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.m_value.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    config::base_option::~base_option(&local_c0.super_base_option);
  }
  return sVar1 == sVar2;
}

Assistant:

bool serialize_if_t(base_option& base_option)
  {
    if (base_option.m_type_hash == typeid(T).hash_code())
    {
      auto typed = dynamic_cast<typed_option<T>&>(base_option);
      serialize(typed);
      return true;
    }

    return false;
  }